

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockReturnValueTest.cpp
# Opt level: O3

void __thiscall
TEST_MockReturnValueTest_UnsignedLongLongIntegerReturnValue_Test::testBody
          (TEST_MockReturnValueTest_UnsignedLongLongIntegerReturnValue_Test *this)

{
  int iVar1;
  MockSupport *pMVar2;
  undefined4 extraout_var;
  long *plVar3;
  UtestShell *pUVar4;
  cpputest_ulonglong cVar5;
  TestTerminator *pTVar6;
  undefined8 uVar7;
  undefined4 extraout_var_01;
  SimpleString local_78;
  MockNamedValue local_68;
  undefined4 extraout_var_00;
  
  SimpleString::SimpleString((SimpleString *)&local_68,"");
  pMVar2 = mock((SimpleString *)&local_68,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_78,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[3])(pMVar2,&local_78);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0xf0))
            ((long *)CONCAT44(extraout_var,iVar1),7);
  SimpleString::~SimpleString(&local_78);
  SimpleString::~SimpleString((SimpleString *)&local_68);
  SimpleString::SimpleString((SimpleString *)&local_68,"");
  pMVar2 = mock((SimpleString *)&local_68,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_78,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_78);
  plVar3 = (long *)CONCAT44(extraout_var_00,iVar1);
  SimpleString::~SimpleString(&local_78);
  SimpleString::~SimpleString((SimpleString *)&local_68);
  pUVar4 = UtestShell::getCurrent();
  (**(code **)(*plVar3 + 0xa8))(&local_68,plVar3);
  cVar5 = MockNamedValue::getUnsignedLongLongIntValue(&local_68);
  pTVar6 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[0x11])
            (pUVar4,7,cVar5,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
             ,0x239,pTVar6);
  MockNamedValue::~MockNamedValue(&local_68);
  pUVar4 = UtestShell::getCurrent();
  uVar7 = (**(code **)(*plVar3 + 0xf0))(plVar3);
  pTVar6 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[0x11])
            (pUVar4,7,uVar7,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
             ,0x23a,pTVar6);
  pUVar4 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_78,"");
  pMVar2 = mock(&local_78,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[8])(&local_68,pMVar2);
  cVar5 = MockNamedValue::getUnsignedLongLongIntValue(&local_68);
  pTVar6 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[0x11])
            (pUVar4,7,cVar5,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
             ,0x23b,pTVar6);
  MockNamedValue::~MockNamedValue(&local_68);
  SimpleString::~SimpleString(&local_78);
  pUVar4 = UtestShell::getCurrent();
  SimpleString::SimpleString((SimpleString *)&local_68,"");
  pMVar2 = mock((SimpleString *)&local_68,(MockFailureReporter *)0x0);
  iVar1 = (*pMVar2->_vptr_MockSupport[0x14])(pMVar2);
  pTVar6 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[0x11])
            (pUVar4,7,CONCAT44(extraout_var_01,iVar1),0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
             ,0x23c,pTVar6);
  SimpleString::~SimpleString((SimpleString *)&local_68);
  return;
}

Assistant:

TEST(MockReturnValueTest, UnsignedLongLongIntegerReturnValue)
{
    unsigned long long int expected_value = 7;
    mock().expectOneCall("foo").andReturnValue(expected_value);

    MockActualCall& actual_call = mock().actualCall("foo");
    UNSIGNED_LONGLONGS_EQUAL(expected_value, actual_call.returnValue().getUnsignedLongLongIntValue());
    UNSIGNED_LONGLONGS_EQUAL(expected_value, actual_call.returnUnsignedLongLongIntValue());
    UNSIGNED_LONGLONGS_EQUAL(expected_value, mock().returnValue().getUnsignedLongLongIntValue());
    UNSIGNED_LONGLONGS_EQUAL(expected_value, mock().unsignedLongLongIntReturnValue());
}